

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::registerTargetedEndpoint
          (CommonCore *this,LocalFederateId federateID,string_view name,string_view type)

{
  string_view name_00;
  string_view string1;
  string_view key;
  string_view type_00;
  string_view units;
  string_view units_00;
  string_view key_00;
  uint16_t uVar1;
  uint uVar2;
  InterfaceHandle IVar3;
  _Alloc_hider this_00;
  undefined6 extraout_var;
  pair<helics::route_id,_helics::ActionMessage> *this_01;
  undefined8 in_RDX;
  CommonCore *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  __sv_type _Var4;
  ActionMessage reg;
  pair<helics::route_id,_helics::ActionMessage> *handle;
  int flags;
  FederateState *fed;
  InterfaceHandle hid;
  atomic<helics::GlobalFederateId> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  undefined8 this_02;
  FederateState *in_stack_fffffffffffffdc8;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  action_t in_stack_fffffffffffffddc;
  InterfaceType HandleType;
  CommonCore *this_03;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  uint16_t in_stack_fffffffffffffe40;
  uint16_t in_stack_fffffffffffffeb4;
  InterfaceType in_stack_fffffffffffffeb7;
  FederateState *in_stack_fffffffffffffeb8;
  string_view in_stack_fffffffffffffec0;
  InterfaceHandle in_stack_fffffffffffffed4;
  string_view in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffef0;
  char *pcStack_100;
  undefined1 local_c8 [56];
  Time TStack_90;
  BaseType local_70;
  BaseType local_6c;
  Time local_68;
  uint local_5c;
  _Alloc_hider in_stack_ffffffffffffffc8;
  _Alloc_hider _Var7;
  
  uVar6 = 0x65;
  key_00._M_str = (char *)in_R9;
  key_00._M_len = in_R8;
  this_00._M_p = (pointer)checkNewInterface(in_RDI,(LocalFederateId)
                                                   (BaseType)((ulong)in_RDX >> 0x20),key_00,
                                            (InterfaceType)
                                            ((ulong)in_stack_ffffffffffffffc8._M_p >> 0x38));
  uVar1 = FederateState::getInterfaceFlags(in_stack_fffffffffffffdc8);
  uVar2 = (uint)CONCAT62(extraout_var,uVar1);
  uVar1 = make_flags(10);
  local_5c = uVar2 & 0xffff | (uint)uVar1;
  TStack_90.internalTimeCode = in_R9;
  local_6c = (BaseType)std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffdb8);
  HandleType = (InterfaceType)(uVar2 >> 0x18);
  local_70 = ((LocalFederateId *)(this_00._M_p + 0x28))->fid;
  this_03 = (CommonCore *)local_c8;
  this_02 = TStack_90.internalTimeCode;
  std::__cxx11::string::string(in_stack_fffffffffffffdd0);
  local_c8._32_16_ =
       (undefined1  [16])
       std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdc0);
  key._M_str._0_4_ = in_stack_fffffffffffffe08;
  key._M_len = (size_t)in_RDI;
  key._M_str._4_4_ = uVar6;
  type_00._M_str = in_stack_fffffffffffffe28;
  type_00._M_len = in_stack_fffffffffffffe20;
  units._M_str._0_4_ = in_stack_fffffffffffffe38;
  units._M_len = in_stack_fffffffffffffe30;
  units._M_str._4_4_ = in_stack_fffffffffffffe3c;
  this_01 = createBasicHandle(this_03,(GlobalFederateId)
                                      (BaseType)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                              (LocalFederateId)(BaseType)in_stack_fffffffffffffe10,HandleType,key,
                              type_00,units,in_stack_fffffffffffffe40);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TStack_90.internalTimeCode);
  local_68.internalTimeCode = (baseType)this_01;
  IVar3 = BasicHandleInfo::getInterfaceHandle((BasicHandleInfo *)this_01);
  _Var7._M_p = this_00._M_p;
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     TStack_90.internalTimeCode);
  pcVar5 = (char *)_Var4._M_len;
  pcStack_100 = _Var4._M_str;
  units_00._M_str = pcVar5;
  units_00._M_len = in_stack_fffffffffffffef0;
  FederateState::createInterface
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb7,in_stack_fffffffffffffed4,
             in_stack_fffffffffffffec0,in_stack_fffffffffffffee0,units_00,in_stack_fffffffffffffeb4)
  ;
  ActionMessage::ActionMessage((ActionMessage *)this_00._M_p,in_stack_fffffffffffffddc);
  std::atomic<helics::GlobalFederateId>::load
            ((atomic<helics::GlobalFederateId> *)(_Var7._M_p + 0x2c),seq_cst);
  name_00._M_str = (char *)this_02;
  name_00._M_len = in_R8;
  ActionMessage::name((ActionMessage *)0x53bcf6,name_00);
  string1._M_str = pcStack_100;
  string1._M_len = (size_t)pcVar5;
  ActionMessage::setStringData((ActionMessage *)this_02,string1);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>
            ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
             in_RDI,(ActionMessage *)this_03);
  ActionMessage::~ActionMessage((ActionMessage *)this_02);
  return (InterfaceHandle)IVar3.hid;
}

Assistant:

InterfaceHandle CommonCore::registerTargetedEndpoint(LocalFederateId federateID,
                                                     std::string_view name,
                                                     std::string_view type)
{
    auto* fed = checkNewInterface(federateID, name, InterfaceType::ENDPOINT);

    auto flags = fed->getInterfaceFlags() | make_flags(targeted_flag);

    const auto& handle = createBasicHandle(
        fed->global_id, fed->local_id, InterfaceType::ENDPOINT, name, type, std::string{}, flags);

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(InterfaceType::ENDPOINT, hid, name, type, gEmptyString, flags);
    ActionMessage reg(CMD_REG_ENDPOINT);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(name);
    reg.setStringData(type);
    reg.flags = handle.flags;
    actionQueue.push(std::move(reg));

    return hid;
}